

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwrite.c
# Opt level: O0

void png_write_end(png_structrp png_ptr,png_inforp info_ptr)

{
  int local_1c;
  int i;
  png_inforp info_ptr_local;
  png_structrp png_ptr_local;
  
  if (png_ptr != (png_structrp)0x0) {
    if ((png_ptr->mode & 4) == 0) {
      png_error(png_ptr,"No IDATs written into file");
    }
    if ((png_ptr->color_type == '\x03') &&
       ((int)(uint)png_ptr->num_palette <= png_ptr->num_palette_max)) {
      png_benign_error(png_ptr,"Wrote palette index exceeding num_palette");
    }
    if (info_ptr != (png_inforp)0x0) {
      if (((info_ptr->valid & 0x200) != 0) && ((png_ptr->mode & 0x200) == 0)) {
        png_write_tIME(png_ptr,&info_ptr->mod_time);
      }
      for (local_1c = 0; local_1c < info_ptr->num_text; local_1c = local_1c + 1) {
        if (info_ptr->text[local_1c].compression < 1) {
          if (info_ptr->text[local_1c].compression < 0) {
            if (info_ptr->text[local_1c].compression == -1) {
              png_write_tEXt(png_ptr,info_ptr->text[local_1c].key,info_ptr->text[local_1c].text,0);
              info_ptr->text[local_1c].compression = -3;
            }
          }
          else {
            png_write_zTXt(png_ptr,info_ptr->text[local_1c].key,info_ptr->text[local_1c].text,
                           info_ptr->text[local_1c].compression);
            info_ptr->text[local_1c].compression = -2;
          }
        }
        else {
          png_write_iTXt(png_ptr,info_ptr->text[local_1c].compression,info_ptr->text[local_1c].key,
                         info_ptr->text[local_1c].lang,info_ptr->text[local_1c].lang_key,
                         info_ptr->text[local_1c].text);
          if (info_ptr->text[local_1c].compression == -1) {
            info_ptr->text[local_1c].compression = -3;
          }
          else {
            info_ptr->text[local_1c].compression = -2;
          }
        }
      }
      if (((info_ptr->valid & 0x10000) != 0) && ((png_ptr->mode & 0x4000) == 0)) {
        png_write_eXIf(png_ptr,info_ptr->exif,info_ptr->num_exif);
      }
      write_unknown_chunks(png_ptr,info_ptr,8);
    }
    png_ptr->mode = png_ptr->mode | 8;
    png_write_IEND(png_ptr);
  }
  return;
}

Assistant:

void PNGAPI
png_write_end(png_structrp png_ptr, png_inforp info_ptr)
{
   png_debug(1, "in png_write_end");

   if (png_ptr == NULL)
      return;

   if ((png_ptr->mode & PNG_HAVE_IDAT) == 0)
      png_error(png_ptr, "No IDATs written into file");

#ifdef PNG_WRITE_CHECK_FOR_INVALID_INDEX_SUPPORTED
   if (png_ptr->color_type == PNG_COLOR_TYPE_PALETTE &&
       png_ptr->num_palette_max >= png_ptr->num_palette)
      png_benign_error(png_ptr, "Wrote palette index exceeding num_palette");
#endif

   /* See if user wants us to write information chunks */
   if (info_ptr != NULL)
   {
#ifdef PNG_WRITE_TEXT_SUPPORTED
      int i; /* local index variable */
#endif
#ifdef PNG_WRITE_tIME_SUPPORTED
      /* Check to see if user has supplied a time chunk */
      if ((info_ptr->valid & PNG_INFO_tIME) != 0 &&
          (png_ptr->mode & PNG_WROTE_tIME) == 0)
         png_write_tIME(png_ptr, &(info_ptr->mod_time));

#endif
#ifdef PNG_WRITE_TEXT_SUPPORTED
      /* Loop through comment chunks */
      for (i = 0; i < info_ptr->num_text; i++)
      {
         png_debug2(2, "Writing trailer text chunk %d, type %d", i,
             info_ptr->text[i].compression);
         /* An internationalized chunk? */
         if (info_ptr->text[i].compression > 0)
         {
#ifdef PNG_WRITE_iTXt_SUPPORTED
            /* Write international chunk */
            png_write_iTXt(png_ptr,
                info_ptr->text[i].compression,
                info_ptr->text[i].key,
                info_ptr->text[i].lang,
                info_ptr->text[i].lang_key,
                info_ptr->text[i].text);
            /* Mark this chunk as written */
            if (info_ptr->text[i].compression == PNG_TEXT_COMPRESSION_NONE)
               info_ptr->text[i].compression = PNG_TEXT_COMPRESSION_NONE_WR;
            else
               info_ptr->text[i].compression = PNG_TEXT_COMPRESSION_zTXt_WR;
#else
            png_warning(png_ptr, "Unable to write international text");
#endif
         }

         else if (info_ptr->text[i].compression >= PNG_TEXT_COMPRESSION_zTXt)
         {
#ifdef PNG_WRITE_zTXt_SUPPORTED
            /* Write compressed chunk */
            png_write_zTXt(png_ptr, info_ptr->text[i].key,
                info_ptr->text[i].text, info_ptr->text[i].compression);
            /* Mark this chunk as written */
            info_ptr->text[i].compression = PNG_TEXT_COMPRESSION_zTXt_WR;
#else
            png_warning(png_ptr, "Unable to write compressed text");
#endif
         }

         else if (info_ptr->text[i].compression == PNG_TEXT_COMPRESSION_NONE)
         {
#ifdef PNG_WRITE_tEXt_SUPPORTED
            /* Write uncompressed chunk */
            png_write_tEXt(png_ptr, info_ptr->text[i].key,
                info_ptr->text[i].text, 0);
            /* Mark this chunk as written */
            info_ptr->text[i].compression = PNG_TEXT_COMPRESSION_NONE_WR;
#else
            png_warning(png_ptr, "Unable to write uncompressed text");
#endif
         }
      }
#endif

#ifdef PNG_WRITE_eXIf_SUPPORTED
      if ((info_ptr->valid & PNG_INFO_eXIf) != 0 &&
          (png_ptr->mode & PNG_WROTE_eXIf) == 0)
         png_write_eXIf(png_ptr, info_ptr->exif, info_ptr->num_exif);
#endif

#ifdef PNG_WRITE_UNKNOWN_CHUNKS_SUPPORTED
      write_unknown_chunks(png_ptr, info_ptr, PNG_AFTER_IDAT);
#endif
   }

   png_ptr->mode |= PNG_AFTER_IDAT;

   /* Write end of PNG file */
   png_write_IEND(png_ptr);

   /* This flush, added in libpng-1.0.8, removed from libpng-1.0.9beta03,
    * and restored again in libpng-1.2.30, may cause some applications that
    * do not set png_ptr->output_flush_fn to crash.  If your application
    * experiences a problem, please try building libpng with
    * PNG_WRITE_FLUSH_AFTER_IEND_SUPPORTED defined, and report the event to
    * png-mng-implement at lists.sf.net .
    */
#ifdef PNG_WRITE_FLUSH_SUPPORTED
#  ifdef PNG_WRITE_FLUSH_AFTER_IEND_SUPPORTED
   png_flush(png_ptr);
#  endif
#endif
}